

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O2

bool ReadSuperCardPro(string *path,shared_ptr<Disk> *disk)

{
  element_type *peVar1;
  bool bVar2;
  mapped_type *pmVar3;
  exception *this;
  allocator<char> local_79;
  shared_ptr<SCPDevDisk> scp_dev_disk;
  SuperCardPro *local_68;
  int fw_version;
  int hw_version;
  string local_58;
  key_type local_38;
  
  util::lowercase(&local_58,path);
  bVar2 = std::operator!=(&local_58,"scp:");
  std::__cxx11::string::~string((string *)&local_58);
  if (!bVar2) {
    SuperCardPro::Open();
    if (local_68 == (SuperCardPro *)0x0) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[36]>
                (this,(char (*) [36])"failed to open SuperCard Pro device");
      __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    hw_version = 0;
    fw_version = 0;
    SuperCardPro::GetInfo(local_68,&hw_version,&fw_version);
    std::make_shared<SCPDevDisk,std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>>
              ((unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)&scp_dev_disk);
    local_58._M_dataplus._M_p = (pointer)0x100000052;
    DemandDisk::extend(&(scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_DemandDisk,(CylHead *)&local_58);
    VersionString_abi_cxx11_(&local_58,hw_version);
    peVar1 = scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"hw_version",&local_79);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(peVar1->super_DemandDisk).super_Disk.metadata,&local_38);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    VersionString_abi_cxx11_(&local_58,fw_version);
    peVar1 = scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"fw_version",&local_79);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(peVar1->super_DemandDisk).super_Disk.metadata,&local_38);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::assign
              ((char *)&((scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_DemandDisk).super_Disk.strType);
    std::__shared_ptr<Disk,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Disk,(__gnu_cxx::_Lock_policy)2> *)disk,
               &scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    if (local_68 != (SuperCardPro *)0x0) {
      (*local_68->_vptr_SuperCardPro[1])();
    }
  }
  return !bVar2;
}

Assistant:

bool ReadSuperCardPro(const std::string& path, std::shared_ptr<Disk>& disk)
{
    // ToDo: use path to select from multiple devices?
    if (util::lowercase(path) != "scp:")
        return false;

    auto supercardpro = SuperCardPro::Open();
    if (!supercardpro)
        throw util::exception("failed to open SuperCard Pro device");

    int hw_version = 0, fw_version = 0;
    supercardpro->GetInfo(hw_version, fw_version);

    auto scp_dev_disk = std::make_shared<SCPDevDisk>(std::move(supercardpro));
    scp_dev_disk->extend(CylHead(83 - 1, 2 - 1));

    scp_dev_disk->metadata["hw_version"] = VersionString(hw_version);
    scp_dev_disk->metadata["fw_version"] = VersionString(fw_version);

    scp_dev_disk->strType = "SuperCard Pro";
    disk = scp_dev_disk;

    return true;
}